

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O3

bool __thiscall qpdf::Array::setAt(Array *this,int at,QPDFObjectHandle *oh)

{
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var1;
  element_type *peVar2;
  element_type *peVar3;
  QPDF *pQVar4;
  QPDF_Array *pQVar5;
  pointer pQVar6;
  logic_error *this_00;
  int iVar7;
  int local_1c;
  
  if (-1 < at) {
    local_1c = at;
    pQVar5 = array(this);
    _Var1._M_head_impl =
         (pQVar5->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    if (_Var1._M_head_impl == (Sparse *)0x0) {
      iVar7 = (int)((ulong)((long)(pQVar5->elements).
                                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pQVar5->elements).
                                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    else {
      iVar7 = (_Var1._M_head_impl)->size;
    }
    if (at < iVar7) {
      pQVar5 = array(this);
      peVar2 = (oh->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,"Attempting to add an uninitialized object to a QPDF_Array.");
      }
      else {
        peVar3 = (this->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (((peVar3 == (element_type *)0x0) || (pQVar4 = peVar3->qpdf, pQVar4 == (QPDF *)0x0)) ||
           (pQVar4 == peVar2->qpdf || peVar2->qpdf == (QPDF *)0x0)) {
          _Var1._M_head_impl =
               (pQVar5->sp)._M_t.
               super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>.
               _M_t.
               super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
               .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
          if (_Var1._M_head_impl == (Sparse *)0x0) {
            pQVar6 = (pQVar5->elements).
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_start + (uint)at;
            (pQVar6->super_BaseHandle).obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
          }
          else {
            pQVar6 = std::
                     map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                     ::operator[](&(_Var1._M_head_impl)->elements,&local_1c);
            (pQVar6->super_BaseHandle).obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (oh->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pQVar6->super_BaseHandle).obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &(oh->super_BaseHandle).obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          return true;
        }
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,
                   "Attempting to add an object from a different QPDF. Use QPDF::copyForeignObject to add objects from another file."
                  );
      }
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  return false;
}

Assistant:

bool
Array::setAt(int at, QPDFObjectHandle const& oh)
{
    if (at < 0 || at >= size()) {
        return false;
    }
    auto a = array();
    checkOwnership(oh);
    if (a->sp) {
        a->sp->elements[at] = oh;
    } else {
        a->elements[size_t(at)] = oh;
    }
    return true;
}